

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::checkIntEquals
               (TestContext *testCtx,GLint got,GLint expected)

{
  ostringstream *this;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  if (got != expected) {
    local_1a0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"// ERROR: Expected ",0x13);
    std::ostream::operator<<(this,expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
    std::ostream::operator<<(this,got);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  return;
}

Assistant:

void checkIntEquals (tcu::TestContext& testCtx, GLint got, GLint expected)
{
	using tcu::TestLog;

	if (got != expected)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << expected << "; got " << got << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
	}
}